

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O2

void seq_print(uint32_t *script,uint32_t len,rnndeccontext *ctx,rnndomain *mmiodom)

{
  uint uVar1;
  rnndecaddrinfo *prVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  seq_op *psVar12;
  int iVar13;
  long lVar14;
  
  uVar3 = 0;
  while (uVar3 < len) {
    uVar11 = script[uVar3];
    if (((0x3c < (uVar11 & 0xffff)) || (uVar11 + 0xfc000000 < 0xfc010000)) ||
       (uVar3 = (uVar11 >> 0x10) + uVar3, len < uVar3)) {
      return;
    }
  }
  printf("SEQ script, size: %uB\n",(ulong)(len * 4));
  uVar5 = 0;
  do {
    pcVar4 = "%06x: Invalid op\n";
    uVar3 = (uint)uVar5;
    if (len <= uVar3) {
      return;
    }
    uVar11 = script[uVar5];
    uVar1 = uVar11 & 0xffff;
    if (0x3c < uVar1) {
LAB_0024e09a:
      printf(pcVar4,(ulong)(uVar3 << 2));
      return;
    }
    uVar6 = uVar11 >> 0x10;
    if (uVar6 < seq_ops[uVar1].min_size) {
      pcVar4 = "%06x: Opcode size too small\n";
      goto LAB_0024e09a;
    }
    psVar12 = seq_ops + uVar1;
    pcVar4 = "reg_last+";
    pcVar9 = "";
    switch(uVar1) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
      pcVar4 = "reg_last";
      if ((uVar11 & 1) == 0) {
        pcVar4 = "val_last";
      }
      printf("%06x: %-14s%s      %s 0x%08x\n",(ulong)(uVar3 * 4),psVar12->txt,pcVar4,
             seq_ops[uVar1 >> 1].binop,(ulong)script[uVar5 + 1]);
      break;
    case 10:
    case 0xc:
      uVar10 = 0;
      pcVar9 = "reg_last+";
      if (uVar1 - 0xb < 2) goto switchD_0024db49_caseD_b;
      goto LAB_0024dcd3;
    case 0xb:
switchD_0024db49_caseD_b:
      pcVar4 = pcVar9;
      uVar10 = (ulong)script[uVar5 + 1];
LAB_0024dcd3:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar9 = psVar12->txt;
      pcVar8 = "%06x: %-14sval_last   :=  R[%s0x%06x]\n";
      goto LAB_0024dd09;
    case 0xd:
    case 0xe:
    case 0xf:
      pcVar4 = "";
      if ((uVar11 & 0xfffd) == 0xd) {
        pcVar4 = "reg_last+";
      }
      uVar10 = 0;
      if ((uVar11 & 0xfffe) == 0xe) {
        uVar10 = (ulong)script[uVar5 + 1];
      }
      uVar7 = (ulong)(uVar3 * 4);
      pcVar9 = psVar12->txt;
      pcVar8 = "%06x: %-14sR[%s0x%06x]   :=  val_last\n";
      goto LAB_0024dd09;
    default:
      printf("%06x: %-14s\n",(ulong)(uVar3 * 4),psVar12->txt);
      break;
    case 0x13:
    case 0x2e:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar4 = psVar12->txt;
      uVar5 = (ulong)script[uVar5 + 1];
      pcVar9 = "%06x: %-14s%u ns\n";
      goto LAB_0024df8a;
    case 0x14:
      uVar11 = script[uVar5 + 1];
      if ((short)uVar11 == 0) {
        pcVar4 = "HEAD0_VBLANK";
      }
      else {
        uVar1 = uVar11 & 0xffff;
        if (uVar1 == 0x400) {
          pcVar4 = "PGRAPH_IDLE ";
        }
        else if (uVar1 == 0x100) {
          pcVar4 = "HEAD0_HBLANK";
        }
        else if (uVar1 == 0x101) {
          pcVar4 = "HEAD1_HBLANK";
        }
        else if (uVar1 == 0x300) {
          pcVar4 = "FB_PAUSED   ";
        }
        else if (uVar1 == 1) {
          pcVar4 = "HEAD1_VBLANK";
        }
        else {
          printf("%06x: Invalid param %08x for op 0x14\n",(ulong)(uVar3 * 4),(ulong)uVar11,
                 "reg_last+");
          uVar11 = script[uVar5 + 1];
          pcVar4 = "(unknown)   ";
        }
      }
      uVar7 = (ulong)(uVar3 * 4);
      pcVar9 = psVar12->txt;
      uVar10 = (ulong)script[uVar3 + 2];
      if ((uVar11 >> 0x10 & 1) == 0) {
        pcVar8 = "%06x: %-14s%s  , %u ns\n";
      }
      else {
        pcVar8 = "%06x: %-14s!%s , %u ns\n";
      }
      goto LAB_0024dd09;
    case 0x15:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar4 = psVar12->txt;
      uVar5 = (ulong)script[uVar5 + 1];
      uVar10 = (ulong)script[uVar3 + 2];
      pcVar9 = "%06x: %-14sR[last_reg] & 0x%08x == val_last, %u ns\n";
      goto LAB_0024dfd8;
    case 0x17:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar4 = psVar12->txt;
      uVar5 = (ulong)script[uVar5 + 1];
      pcVar9 = "%06x: %-14sval_last, %08x\n";
      goto LAB_0024df8a;
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar4 = psVar12->txt;
      uVar5 = (ulong)(script[uVar5 + 1] << 2);
      pcVar9 = "%06x: %-14s0x%06x\n";
      goto LAB_0024df8a;
    case 0x1f:
    case 0x2c:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar9 = psVar12->txt;
      pcVar4 = seq_ops[uVar1].binop;
      uVar10 = (ulong)script[uVar5 + 1];
      pcVar8 = "%06x: %-14sval_last      %s R[0x%06x]\n";
      goto LAB_0024dd09;
    case 0x20:
      if (script[uVar5 + 1] == 1) {
        pcVar4 = "%06x: FB PAUSE\n";
      }
      else {
        pcVar4 = "%06x: FB RESUME\n";
      }
      printf(pcVar4,(ulong)(uVar3 * 4),"","reg_last+");
      break;
    case 0x21:
      printf("%06x: SET REGISTERS:\n",(ulong)(uVar3 * 4),"","reg_last+");
      uVar11 = uVar3 * 4 - 4;
      for (lVar14 = 0; iVar13 = (int)lVar14, lVar14 + 1U < (ulong)uVar6; lVar14 = lVar14 + 2) {
        uVar1 = iVar13 + uVar3 + 1;
        prVar2 = rnndec_decodeaddr(ctx,mmiodom,(ulong)script[uVar1],1);
        uVar11 = uVar11 + 8;
        printf("%06x:               R[0x%06x]   :=  0x%08x     # %s\n",(ulong)uVar11,
               (ulong)script[uVar1],(ulong)script[uVar3 + iVar13 + 2],prVar2->name);
      }
      printf("%06x:               reg_last      :=  0x%08x\n",(ulong)uVar11,
             (ulong)script[(uVar3 + iVar13) - 1]);
      printf("%06x:               val_last      :=  0x%08x\n",(ulong)uVar11,
             (ulong)script[iVar13 + uVar3]);
      break;
    case 0x22:
    case 0x30:
    case 0x32:
      uVar11 = script[uVar5 + 1];
      pcVar4 = psVar12->txt;
      pcVar9 = seq_ops[uVar1].binop;
      pcVar8 = "%06x: %-14sOUT[0x%x]      %s val_last\n";
      goto LAB_0024dc52;
    case 0x23:
    case 0x31:
    case 0x33:
      uVar11 = script[uVar5 + 1];
      pcVar4 = psVar12->txt;
      pcVar9 = seq_ops[uVar1].binop;
      pcVar8 = "%06x: %-14sOUT[OUT[0x%x]] %s val_last\n";
LAB_0024dc52:
      printf(pcVar8,(ulong)(uVar3 * 4),pcVar4,(ulong)uVar11,pcVar9);
      break;
    case 0x24:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar4 = psVar12->txt;
      uVar5 = (ulong)script[uVar5 + 1];
      uVar10 = (ulong)script[uVar3 + 2];
      pcVar9 = "%06x: %-14sOUT[0x%x]      :=  %08x\n";
      goto LAB_0024dfd8;
    case 0x25:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar4 = psVar12->txt;
      uVar5 = (ulong)script[uVar5 + 1];
      uVar10 = (ulong)script[uVar3 + 2];
      pcVar9 = "%06x: %-14sOUT[OUT[0x%x]] :=  %08x\n";
      goto LAB_0024dfd8;
    case 0x26:
    case 0x3b:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar9 = psVar12->txt;
      pcVar4 = seq_ops[uVar1].binop;
      uVar10 = (ulong)script[uVar5 + 1];
      pcVar8 = "%06x: %-14sval_last      %s OUT[0x%x]\n";
      goto LAB_0024dd09;
    case 0x27:
    case 0x3c:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar9 = psVar12->txt;
      pcVar4 = seq_ops[uVar1].binop;
      uVar10 = (ulong)script[uVar5 + 1];
      pcVar8 = "%06x: %-14sval_last      %s OUT[OUT[0x%x]]\n";
LAB_0024dd09:
      printf(pcVar8,uVar7,pcVar9,pcVar4,uVar10);
      break;
    case 0x28:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar4 = psVar12->txt;
      uVar5 = (ulong)script[uVar5 + 1];
      pcVar9 = "%06x: %-14sreg_last      :=  OUT[0x%x]\n";
      goto LAB_0024df8a;
    case 0x29:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar4 = psVar12->txt;
      uVar5 = (ulong)script[uVar5 + 1];
      pcVar9 = "%06x: %-14sreg_last      :=  OUT[OUT[0x%x]]\n";
      goto LAB_0024df8a;
    case 0x2a:
      printf("%06x: %-14sOUT[0x%x]      +=  0x%08x (%d)\n",(ulong)(uVar3 * 4),psVar12->txt,
             (ulong)script[uVar5 + 1],(ulong)script[uVar3 + 2],(ulong)script[uVar3 + 2]);
      break;
    case 0x2b:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar4 = psVar12->txt;
      uVar5 = (ulong)script[uVar5 + 1];
      uVar10 = (ulong)script[uVar3 + 2];
      pcVar9 = "%06x: %-14sOUT[0x%x], 0x%08x\n";
      goto LAB_0024dfd8;
    case 0x2d:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar4 = psVar12->txt;
      uVar5 = (ulong)script[uVar5 + 1];
      uVar10 = (ulong)script[uVar3 + 2];
      pcVar9 = "%06x: %-14sHEAD%d HEAD%d\n";
LAB_0024dfd8:
      printf(pcVar9,uVar7,pcVar4,uVar5,uVar10);
      break;
    case 0x34:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar4 = psVar12->txt;
      uVar5 = (ulong)script[uVar5 + 1];
      pcVar9 = "%06x: %-14sOUT[0x%x]\n";
      goto LAB_0024df8a;
    case 0x35:
      uVar7 = (ulong)(uVar3 * 4);
      pcVar4 = psVar12->txt;
      uVar5 = (ulong)script[uVar5 + 1];
      pcVar9 = "%06x: %-14sOUT[OUT[0x%x]]\n";
LAB_0024df8a:
      printf(pcVar9,uVar7,pcVar4,uVar5);
    }
    uVar5 = (ulong)(uVar6 + uVar3);
  } while( true );
}

Assistant:

void
seq_print(uint32_t *script, uint32_t len, struct rnndeccontext *ctx, struct rnndomain *mmiodom)
{
	unsigned int pc, op, size;
	char *reg0;
	unsigned int reg1, i;
	const char *wait_op;

	/* Validate script, bail if invalid */
	for(pc = 0; pc < len; pc += size) {
		op = script[pc] & 0xffff;
		size = (script[pc] & 0xffff0000) >> 16;

		if(op > 0x3c || size > 0x3ff || size == 0)
			return;

		if(pc + size > len)
			return;
	}

	printf("SEQ script, size: %uB\n", len << 2);

	for(pc = 0; pc < len; pc += size) {
		op = script[pc] & 0xffff;
		size = (script[pc] & 0xffff0000) >> 16;

		if(op > 0x3c) {
			seq_out(pc,"Invalid op\n");
			return;
		}

		if(seq_ops[op].min_size > size){
			seq_out(pc,"Opcode size too small\n");
			return;
		}

		switch(op) {
		case 0x0:
		case 0x1:
		case 0x2:
		case 0x3:
		case 0x4:
		case 0x5:
		case 0x6:
		case 0x7:
		case 0x8:
		case 0x9:
			seq_outlast(pc,op,script[pc+1]);
			break;
		case 0xa:
		case 0xb:
		case 0xc:
			reg0 = "";
			reg1 = 0;

			if(op == 0xa || op == 0x0c) {
			        reg0 = "reg_last+";
			}

			if (op == 0xb || op == 0xc) {
				reg1 = script[pc+1];
			}
			seq_out_op(pc,op,"val_last   :=  R[%s0x%06x]\n",reg0,reg1);
			break;
		case 0xd:
		case 0xe:
		case 0xf:
			reg0 = "";
			reg1 = 0;

			if(op == 0xd || op == 0xf) {
			        reg0 = "reg_last+";
			}

			if (op == 0xe || op == 0xf) {
				reg1 = script[pc+1];
			}
			seq_out_op(pc,op,"R[%s0x%06x]   :=  val_last\n",reg0,reg1);
			break;
		case 0x13:
		case 0x2e:
			seq_out_op(pc,op,"%u ns\n",script[pc+1]);
			break;
		case 0x14:
			//seq_out_op(pc,op,"%s, %u ns\n",seq_wait_status[script[pc+1] & 0xff],script[pc+2]);
			switch(script[pc+1] & 0xffff) {
			case 0x0:
				wait_op = "HEAD0_VBLANK";
				break;
			case 0x1:
				wait_op = "HEAD1_VBLANK";
				break;
			case 0x100:
				wait_op = "HEAD0_HBLANK";
				break;
			case 0x101:
				wait_op = "HEAD1_HBLANK";
				break;
			case 0x300:
				wait_op = "FB_PAUSED   ";
				break;
			case 0x400:
				wait_op = "PGRAPH_IDLE ";
				break;
			default:
				wait_op = "(unknown)   ";
				seq_out(pc,"Invalid param %08x for op 0x14\n", script[pc+1]);
			}

			if(script[pc+1] & 0x10000) {
				seq_out_op(pc,op,"!%s , %u ns\n",wait_op,script[pc+2]);
			} else {
				seq_out_op(pc,op,"%s  , %u ns\n",wait_op,script[pc+2]);
			}
			break;
		case 0x15:
			seq_out_op(pc,op,"R[last_reg] & 0x%08x == val_last, %u ns\n",script[pc+1],script[pc+2]);
			break;
		case 0x16:
			seq_out_op(pc,op,"\n");
			break;
		case 0x17:
			seq_out_op(pc,op,"val_last, %08x\n", script[pc+1]);
			break;
		case 0x18:
		case 0x19:
		case 0x1a:
		case 0x1b:
		case 0x1c:
			seq_out_op(pc,op,"0x%06x\n", script[pc+1] << 2);
			break;
		case 0x1d:
		case 0x1e:
			seq_out_op(pc,op,"\n");
			break;
		case 0x1f:
		case 0x2c:
			seq_out_op(pc,op,"val_last      %s R[0x%06x]\n", seq_ops[op].binop, script[pc+1]);
			break;
		case 0x20:
			if(script[pc+1] == 1)
				seq_out(pc,"FB PAUSE\n");
			else
				seq_out(pc,"FB RESUME\n");
			break;
		case 0x21:
			seq_out(pc,"SET REGISTERS:\n");
			for (i = 1; i < size; i += 2) {
				struct rnndecaddrinfo *ai = rnndec_decodeaddr(ctx, mmiodom, script[pc+i], 1);
				seq_out(pc+i,"              R[0x%06x]   :=  0x%08x     # %s\n", script[pc+i], script[pc+i+1], ai->name);
			}
			seq_out(pc+i-2,"              reg_last      :=  0x%08x\n", script[pc+i-2]);
			seq_out(pc+i-2,"              val_last      :=  0x%08x\n", script[pc+i-1]);
			break;
		case 0x22:
		case 0x30:
		case 0x32:
			seq_out_op(pc,op,"OUT[0x%x]      %s val_last\n", script[pc+1], seq_ops[op].binop);
			break;
		case 0x23:
		case 0x31:
		case 0x33:
			seq_out_op(pc,op,"OUT[OUT[0x%x]] %s val_last\n", script[pc+1], seq_ops[op].binop);
			break;
		case 0x24:
			seq_out_op(pc,op,"OUT[0x%x]      :=  %08x\n", script[pc+1], script[pc+2]);
			break;
		case 0x25:
			seq_out_op(pc,op,"OUT[OUT[0x%x]] :=  %08x\n", script[pc+1], script[pc+2]);
			break;
		case 0x26:
		case 0x3b:
			seq_out_op(pc,op,"val_last      %s OUT[0x%x]\n", seq_ops[op].binop, script[pc+1]);
			break;
		case 0x27:
		case 0x3c:
			seq_out_op(pc,op,"val_last      %s OUT[OUT[0x%x]]\n", seq_ops[op].binop, script[pc+1]);
			break;
		case 0x28:
			seq_out_op(pc,op,"reg_last      :=  OUT[0x%x]\n", script[pc+1]);
			break;
		case 0x29:
			seq_out_op(pc,op,"reg_last      :=  OUT[OUT[0x%x]]\n", script[pc+1]);
			break;
		case 0x2a:
			seq_out_op(pc,op,"OUT[0x%x]      +=  0x%08x (%d)\n", script[pc+1], script[pc+2], script[pc+2]);
			break;
		case 0x2b:
			seq_out_op(pc,op,"OUT[0x%x], 0x%08x\n", script[pc+1], script[pc+2]);
			break;
		case 0x2d:
			seq_out_op(pc,op,"HEAD%d HEAD%d\n", script[pc+1], script[pc+2]);
			break;
		case 0x34:
			seq_out_op(pc,op,"OUT[0x%x]\n", script[pc+1]);
			break;
		case 0x35:
			seq_out_op(pc,op,"OUT[OUT[0x%x]]\n", script[pc+1]);
			break;
		default:
			seq_out_op(pc,op,"\n");
			break;
		}
	}
}